

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O1

void __thiscall Dual_Resampler::resize(Dual_Resampler *this,int pairs)

{
  uint uVar1;
  
  uVar1 = pairs * 2;
  if ((this->sample_buf_size != uVar1) && ((ulong)uVar1 <= (this->sample_buf).size_)) {
    this->sample_buf_size = uVar1;
    this->oversamples_per_frame =
         (int)((double)pairs * (this->resampler).super_Fir_Resampler_.ratio_) * 2 + 2;
    this->buf_pos = uVar1;
    Fir_Resampler_::clear(&(this->resampler).super_Fir_Resampler_);
    return;
  }
  return;
}

Assistant:

void Dual_Resampler::resize( int pairs )
{
	int new_sample_buf_size = pairs * 2;
	if ( sample_buf_size != new_sample_buf_size )
	{
		if ( (unsigned) new_sample_buf_size > sample_buf.size() )
		{
			check( false );
			return;
		}
		sample_buf_size = new_sample_buf_size;
		oversamples_per_frame = int (pairs * resampler.ratio()) * 2 + 2;
		clear();
	}
}